

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O1

Aig_Man_t * Aig_ManExtractMiter(Aig_Man_t *p,Aig_Obj_t *pNode1,Aig_Obj_t *pNode2)

{
  char *pcVar1;
  void *pvVar2;
  int iVar3;
  Aig_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Obj_t *pAVar7;
  long lVar8;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pName = pcVar5;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pSpec = pcVar5;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      pvVar2 = pVVar6->pArray[lVar8];
      pAVar7 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
      lVar8 = lVar8 + 1;
      pVVar6 = p->vCis;
    } while (lVar8 < pVVar6->nSize);
  }
  Aig_ManDup_rec(p_00,p,pNode1);
  Aig_ManDup_rec(p_00,p,pNode2);
  pAVar7 = Aig_Exor(p_00,(Aig_Obj_t *)(pNode1->field_5).pData,(Aig_Obj_t *)(pNode2->field_5).pData);
  Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                       ((ulong)(((uint)pAVar7 ^
                                *(uint *)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) ^
                       (ulong)pAVar7));
  iVar3 = Aig_ManCheck(p_00);
  if (iVar3 == 0) {
    puts("Aig_ManExtractMiter(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManExtractMiter( Aig_Man_t * p, Aig_Obj_t * pNode1, Aig_Obj_t * pNode2 )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    // dump the nodes
    Aig_ManDup_rec( pNew, p, pNode1 );   
    Aig_ManDup_rec( pNew, p, pNode2 );   
    // construct the EXOR
    pObj = Aig_Exor( pNew, (Aig_Obj_t *)pNode1->pData, (Aig_Obj_t *)pNode2->pData ); 
    pObj = Aig_NotCond( pObj, Aig_Regular(pObj)->fPhase ^ Aig_IsComplement(pObj) );
    // add the PO
    Aig_ObjCreateCo( pNew, pObj );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManExtractMiter(): The check has failed.\n" );
    return pNew;
}